

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  void *pvVar6;
  long *plVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Layer *pLVar15;
  void *pvVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int k;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  void *pvVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  void *pvVar30;
  uint uVar31;
  uint uVar32;
  float *sptr;
  Allocator *pAVar33;
  uint uVar34;
  size_type __n;
  bool bVar35;
  float fVar36;
  void *local_6e8;
  ulong local_6c0;
  vector<int,_std::allocator<int>_> _space_ofs;
  undefined1 local_648 [36];
  int iStack_624;
  undefined8 uStack_620;
  Allocator *local_618;
  void *local_610;
  int *piStack_608;
  size_t local_600;
  Allocator *local_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  size_t local_5e0;
  pointer local_5d8;
  int *local_5d0;
  pointer local_5c8;
  long *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  pointer local_5a0;
  int *piStack_598;
  pointer local_590;
  long *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  ulong local_568;
  ulong local_560;
  Option opt_g_1;
  ParamDict pd;
  
  iVar14 = bottom_blob->dims;
  if (this->kernel_h == 1 && (this->kernel_w == 1 && iVar14 == 1)) {
    iVar29 = bottom_blob->w;
    if (iVar29 == this->weight_data_size / this->num_output) {
      pLVar15 = create_layer(0xf);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,this->num_output);
      ParamDict::set(&pd,1,this->bias_term);
      ParamDict::set(&pd,2,this->weight_data_size);
      ParamDict::set(&pd,8,this->int8_scale_term);
      pd.use_int8_inference = (uint)this->use_int8_inference;
      (*pLVar15->_vptr_Layer[2])(pLVar15);
      memset(local_648,0,0xe0);
      if ((Mat *)local_648 != &this->weight_data) {
        piVar2 = (this->weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
          if ((int *)local_648._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_648._8_8_ = *(int *)local_648._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_648._8_8_ == 0) {
              if ((Allocator *)local_648._24_8_ == (Allocator *)0x0) {
                if ((void *)local_648._0_8_ != (void *)0x0) {
                  free(*(void **)(local_648._0_8_ + -8));
                }
              }
              else {
                (**(code **)(*(long *)local_648._24_8_ + 8))();
              }
            }
          }
        }
        local_648._0_8_ = (this->weight_data).data;
        local_648._8_8_ = (this->weight_data).refcount;
        local_648._16_8_ = (this->weight_data).elemsize;
        local_648._24_8_ = (this->weight_data).allocator;
        local_648._32_4_ = (this->weight_data).dims;
        iStack_624 = (this->weight_data).w;
        uStack_620._0_4_ = (this->weight_data).h;
        uStack_620._4_4_ = (this->weight_data).c;
        local_618 = (Allocator *)(this->weight_data).cstep;
      }
      if ((Mat *)&local_610 != &this->bias_data) {
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        if (piStack_608 != (int *)0x0) {
          LOCK();
          *piStack_608 = *piStack_608 + -1;
          UNLOCK();
          if (*piStack_608 == 0) {
            if (local_5f8 == (Allocator *)0x0) {
              if (local_610 != (void *)0x0) {
                free(*(void **)((long)local_610 + -8));
              }
            }
            else {
              (**(code **)(*(long *)local_5f8 + 8))();
            }
          }
        }
        local_610 = (this->bias_data).data;
        piStack_608 = (this->bias_data).refcount;
        local_600 = (this->bias_data).elemsize;
        local_5f8 = (this->bias_data).allocator;
        local_5f0._0_4_ = (this->bias_data).dims;
        local_5f0._4_4_ = (this->bias_data).w;
        uStack_5e8._0_4_ = (this->bias_data).h;
        uStack_5e8._4_4_ = (this->bias_data).c;
        local_5e0 = (this->bias_data).cstep;
      }
      uVar8 = local_580;
      uVar10 = uStack_578;
      if (this->int8_scale_term != 0) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&this->weight_data_int8_scale;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x4;
        if (local_5d0 != (int *)0x0) {
          LOCK();
          *local_5d0 = *local_5d0 + -1;
          UNLOCK();
          if (*local_5d0 == 0) {
            if (local_5c0 == (long *)0x0) {
              if (local_5d8 != (pointer)0x0) {
                free(*(void **)(local_5d8 + -2));
              }
            }
            else {
              (**(code **)(*local_5c0 + 8))();
            }
          }
        }
        local_5d8 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_5d0 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_5c8 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_5c0 = (long *)0x0;
        uVar8 = 0x100000002;
        uVar10 = 0x100000004;
        local_5b8 = 0x100000002;
        uStack_5b0 = 0x100000004;
        local_5a8 = 4;
        uVar9 = uVar8;
        uVar11 = uVar10;
        if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish != (pointer)0x0) {
          LOCK();
          *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1;
          UNLOCK();
          if ((*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish == 0) &&
             (uVar9 = local_5b8, uVar11 = uStack_5b0,
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            local_5b8 = uVar8;
            uStack_5b0 = uVar10;
            free(*(void **)(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + -2));
            uVar9 = local_5b8;
            uVar11 = uStack_5b0;
          }
        }
        uStack_5b0 = uVar11;
        local_5b8 = uVar9;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)&this->bottom_blob_int8_scale;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x4;
        if (piStack_598 != (int *)0x0) {
          LOCK();
          *piStack_598 = *piStack_598 + -1;
          UNLOCK();
          if (*piStack_598 == 0) {
            if (local_588 == (long *)0x0) {
              if (local_5a0 != (pointer)0x0) {
                free(*(void **)(local_5a0 + -2));
              }
            }
            else {
              (**(code **)(*local_588 + 8))();
            }
          }
        }
        local_5a0 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        piStack_598 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
        local_590 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_588 = (long *)0x0;
        uVar9 = 0x100000002;
        uVar11 = 0x100000004;
        local_580 = 0x100000002;
        uStack_578 = 0x100000004;
        local_570 = 4;
        uVar8 = uVar9;
        uVar10 = uVar11;
        if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish != (pointer)0x0) {
          LOCK();
          *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1;
          UNLOCK();
          if ((*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish == 0) &&
             (uVar8 = local_580, uVar10 = uStack_578,
             _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            local_580 = uVar9;
            uStack_578 = uVar11;
            free(*(void **)(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + -2));
            uVar8 = local_580;
            uVar10 = uStack_578;
          }
        }
      }
      uStack_578 = uVar10;
      local_580 = uVar8;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)&_space_ofs,(Mat *)local_648);
      (*pLVar15->_vptr_Layer[3])(pLVar15,&_space_ofs);
      (*pLVar15->_vptr_Layer[5])(pLVar15,bottom_blob,top_blob,opt);
      (*pLVar15->_vptr_Layer[1])(pLVar15);
      lVar22 = 0xa8;
      do {
        piVar2 = *(int **)(local_648 + lVar22 + 8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (*(long **)(local_648 + lVar22 + 0x18) == (long *)0x0) {
              if (*(long *)(local_648 + lVar22) != 0) {
                free(*(void **)(*(long *)(local_648 + lVar22) + -8));
              }
            }
            else {
              (**(code **)(**(long **)(local_648 + lVar22 + 0x18) + 8))();
            }
          }
        }
        *(undefined1 (*) [16])(local_648 + lVar22) = (undefined1  [16])0x0;
        *(undefined8 *)(local_648 + lVar22 + 0x10) = 0;
        *(undefined8 *)((long)&local_618 + lVar22) = 0;
        *(undefined1 (*) [16])(local_648 + lVar22 + 0x20) = (undefined1  [16])0x0;
        lVar22 = lVar22 + -0x38;
      } while (lVar22 != -0x38);
      lVar22 = 0x4d8;
      do {
        piVar2 = *(int **)((long)pd.params + lVar22 + -8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            lVar18 = *(long *)((long)pd.params + lVar22 + -0x10);
            plVar7 = *(long **)((long)&pd.params[0].v.data + lVar22);
            if (plVar7 == (long *)0x0) {
              if (lVar18 != 0) {
                free(*(void **)(lVar18 + -8));
              }
            }
            else {
              (**(code **)(*plVar7 + 8))();
            }
          }
        }
        *(undefined1 (*) [16])((long)pd.params + lVar22 + -0x10) = (undefined1  [16])0x0;
        *(undefined8 *)((long)&pd.params[0].loaded + lVar22) = 0;
        *(undefined8 *)((long)&pd.params[0].v.allocator + lVar22) = 0;
        *(undefined1 (*) [16])((long)&pd.params[0].v.refcount + lVar22) = (undefined1  [16])0x0;
        lVar22 = lVar22 + -0x40;
      } while (lVar22 != -0x28);
      return 0;
    }
  }
  else {
    iVar29 = bottom_blob->w;
  }
  iVar28 = bottom_blob->h;
  uVar1 = bottom_blob->c;
  uStack_620._0_4_ = bottom_blob->h;
  uStack_620._4_4_ = bottom_blob->c;
  uVar31 = (this->kernel_w + -1) * this->dilation_w;
  sVar3 = bottom_blob->elemsize;
  uVar34 = (this->kernel_h + -1) * this->dilation_h;
  pd._0_8_ = bottom_blob->data;
  pd._8_8_ = bottom_blob->refcount;
  pd.params[0].v.data = bottom_blob->allocator;
  iVar23 = iVar29;
  uVar32 = uVar1;
  iVar24 = iVar28;
  if ((int *)pd._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)pd._8_8_ = *(int *)pd._8_8_ + 1;
    UNLOCK();
    iVar23 = bottom_blob->w;
    iVar24 = bottom_blob->h;
    uVar32 = bottom_blob->c;
  }
  pd.params[0].v.refcount = (int *)CONCAT44(iVar23,iVar14);
  pd.params[0].v.elemsize = CONCAT44(uVar32,iVar24);
  pd.params[0].v.allocator = (Allocator *)bottom_blob->cstep;
  pd.params[0]._0_8_ = sVar3;
  if ((sVar3 != 1 & this->use_int8_inference) == 1) {
    local_648._24_8_ = opt->workspace_allocator;
    local_648._0_8_ = (void *)0x0;
    local_648._8_8_ = (int *)0x0;
    local_648._16_8_ = 1;
    stack0xfffffffffffff9d8 = (int *)CONCAT44(iVar29,3);
    pAVar33 = (Allocator *)((long)(iVar28 * iVar29) + 0xfU & 0xfffffffffffffff0);
    uVar20 = (long)(int)uVar1 * (long)pAVar33;
    local_618 = pAVar33;
    if (uVar20 == 0) {
      iVar14 = -100;
      goto LAB_0013631e;
    }
    if ((Allocator *)local_648._24_8_ == (Allocator *)0x0) {
      pvVar16 = malloc(uVar20 + 0x1c);
      local_648._0_8_ = (long)pvVar16 + 0x17U & 0xfffffffffffffff0;
      *(void **)(local_648._0_8_ - 8) = pvVar16;
    }
    else {
      local_648._0_8_ = (*(code *)**(undefined8 **)local_648._24_8_)(local_648._24_8_,uVar20 | 4);
      pAVar33 = local_618;
    }
    local_648._8_8_ = local_648._0_8_ + uVar20;
    *(undefined4 *)(local_648._0_8_ + uVar20) = 1;
    lVar22 = (long)uStack_620._4_4_;
    if (lVar22 * (long)pAVar33 == 0) {
      iVar14 = -100;
    }
    else {
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)local_648._24_8_;
      (*this->quantize->_vptr_Layer[5])(this->quantize,bottom_blob);
      if ((int *)local_648._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_648._8_8_ = *(int *)local_648._8_8_ + 1;
        UNLOCK();
      }
      if (pd._8_8_ != 0) {
        LOCK();
        *(int *)pd._8_8_ = *(int *)pd._8_8_ + -1;
        UNLOCK();
        if (*(int *)pd._8_8_ == 0) {
          if (pd.params[0].v.data == (void *)0x0) {
            if (pd._0_8_ != 0) {
              free(*(void **)(pd._0_8_ + -8));
            }
          }
          else {
            (**(code **)(*pd.params[0].v.data + 8))();
          }
        }
      }
      pd.use_winograd_convolution = local_648._0_4_;
      pd.use_sgemm_convolution = local_648._4_4_;
      pd._8_8_ = local_648._8_8_;
      pd.params[0].loaded = local_648._16_4_;
      pd.params[0].field_1 =
           (anon_union_4_2_947300a4_for_anon_struct_64_3_9ed89b7b_1)local_648._20_4_;
      pd.params[0].v.data = (void *)local_648._24_8_;
      pd.params[0].v.refcount = stack0xfffffffffffff9d8;
      pd.params[0].v.elemsize = uStack_620;
      pd.params[0].v.allocator = local_618;
      iVar14 = 0;
      if ((int *)local_648._8_8_ == (int *)0x0) goto LAB_00135bdd;
    }
    LOCK();
    *(int *)local_648._8_8_ = *(int *)local_648._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_648._8_8_ == 0) {
      if ((Allocator *)local_648._24_8_ == (Allocator *)0x0) {
        if ((void *)local_648._0_8_ != (void *)0x0) {
          free(*(void **)(local_648._0_8_ - 8));
        }
      }
      else {
        (**(code **)(*(long *)local_648._24_8_ + 8))();
      }
    }
    if (lVar22 * (long)pAVar33 == 0) goto LAB_0013631e;
  }
LAB_00135bdd:
  local_648._0_4_ = pd.use_winograd_convolution;
  local_648._4_4_ = pd.use_sgemm_convolution;
  local_648._8_8_ = pd._8_8_;
  local_648._16_4_ = pd.params[0].loaded;
  local_648._20_4_ = pd.params[0].field_1;
  local_648._24_8_ = pd.params[0].v.data;
  if (pd._8_8_ != 0) {
    LOCK();
    *(int *)pd._8_8_ = *(int *)pd._8_8_ + 1;
    UNLOCK();
  }
  unique0x10000962 = pd.params[0].v.refcount;
  uStack_620 = pd.params[0].v.elemsize;
  local_618 = pd.params[0].v.allocator;
  iVar14 = this->pad_w;
  iVar23 = this->pad_h;
  if (iVar23 < 1 && iVar14 < 1) {
    if (iVar23 == -0xe9 && iVar14 == -0xe9) {
      iVar29 = uVar31 - (iVar29 + -1) % this->stride_w;
      iVar14 = uVar34 - (iVar28 + -1) % this->stride_h;
      if ((0 < iVar29) || (0 < iVar14)) {
        copy_make_border((Mat *)&pd,(Mat *)local_648,iVar14 / 2,iVar14 - iVar14 / 2,iVar29 / 2,
                         iVar29 - iVar29 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        goto LAB_00135ca9;
      }
      iVar28 = (int)pd.params[0].v.elemsize;
      iVar29 = pd.params[0].v.refcount._4_4_;
    }
LAB_00135d42:
    uVar20 = (long)(int)(~uVar31 + iVar29) / (long)this->stride_w;
    local_568 = uVar20 & 0xffffffff;
    uVar32 = (int)uVar20 + 1;
    iVar28 = (int)(~uVar34 + iVar28) / this->stride_h;
    Mat::create(top_blob,uVar32,iVar28 + 1,this->num_output,sVar3,opt->blob_allocator);
    iVar14 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar31 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar31;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&opt_g_1);
      iVar14 = this->kernel_h;
      if (0 < iVar14) {
        iVar23 = this->dilation_h;
        iVar24 = this->kernel_w;
        iVar12 = this->dilation_w * iVar24;
        iVar13 = 0;
        iVar17 = 0;
        iVar19 = 0;
        do {
          if (0 < iVar24) {
            lVar22 = 0;
            do {
              _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar17 + lVar22] = iVar19;
              iVar19 = iVar19 + this->dilation_w;
              iVar24 = this->kernel_w;
              lVar22 = lVar22 + 1;
            } while ((int)lVar22 < iVar24);
            iVar17 = iVar17 + (int)lVar22;
            iVar14 = this->kernel_h;
          }
          iVar19 = iVar19 + (iVar29 * iVar23 - iVar12);
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar14);
      }
      uVar34 = this->num_output;
      uVar20 = (ulong)uVar34;
      if (this->use_int8_inference == false) {
        if (0 < (int)uVar34) {
          pvVar16 = top_blob->data;
          sVar3 = top_blob->cstep;
          sVar4 = top_blob->elemsize;
          iVar14 = 0;
          local_6c0 = 0;
          do {
            if (-1 < iVar28) {
              pvVar30 = (void *)(sVar3 * sVar4 * local_6c0 + (long)pvVar16);
              iVar29 = this->bias_term;
              pvVar5 = (this->weight_data).data;
              iVar23 = 0;
              do {
                if (-1 < (int)local_568) {
                  pvVar6 = (this->bias_data).data;
                  iVar24 = this->stride_h;
                  iVar12 = this->stride_w;
                  uVar26 = 0;
                  do {
                    if (iVar29 == 0) {
                      fVar36 = 0.0;
                    }
                    else {
                      fVar36 = *(float *)((long)pvVar6 + local_6c0 * 4);
                    }
                    if (0 < (int)uVar1) {
                      uVar27 = 0;
                      pvVar25 = (void *)((long)iVar14 * 4 + (long)pvVar5);
                      do {
                        if (0 < (int)uVar31) {
                          uVar21 = 0;
                          do {
                            fVar36 = fVar36 + *(float *)((long)pvVar25 + uVar21 * 4) *
                                              *(float *)(local_648._0_8_ +
                                                        (long)_space_ofs.
                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar21] *
                                                  4 + (long)local_618 * local_648._16_8_ * uVar27 +
                                                      uVar26 * (long)iVar12 * 4 +
                                                      (long)(iStack_624 * iVar23 * iVar24) * 4);
                            uVar21 = uVar21 + 1;
                          } while (uVar31 != uVar21);
                        }
                        uVar27 = uVar27 + 1;
                        pvVar25 = (void *)((long)pvVar25 + __n * 4);
                      } while (uVar27 != uVar1);
                    }
                    *(float *)((long)pvVar30 + uVar26 * 4) = fVar36;
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar32);
                }
                pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar32 * 4);
                bVar35 = iVar23 != iVar28;
                iVar23 = iVar23 + 1;
              } while (bVar35);
            }
            local_6c0 = local_6c0 + 1;
            iVar14 = iVar14 + uVar31 * uVar1;
            local_560 = uVar20;
          } while (local_6c0 != uVar20);
        }
      }
      else {
        if (0 < (int)uVar34) {
          pvVar16 = top_blob->data;
          sVar3 = top_blob->cstep;
          sVar4 = top_blob->elemsize;
          lVar22 = 0;
          do {
            if (-1 < iVar28) {
              local_6e8 = (void *)(sVar3 * sVar4 * lVar22 + (long)pvVar16);
              pvVar30 = (this->weight_data).data;
              iVar14 = 0;
              do {
                if (-1 < (int)local_568) {
                  uVar20 = 0;
                  do {
                    if ((int)uVar1 < 1) {
                      iVar29 = 0;
                    }
                    else {
                      uVar26 = 0;
                      iVar29 = 0;
                      lVar18 = (long)(int)(uVar31 * uVar1 * (int)lVar22) + (long)pvVar30;
                      do {
                        if (0 < (int)uVar31) {
                          uVar27 = 0;
                          do {
                            iVar29 = iVar29 + (int)*(char *)(lVar18 + uVar27) *
                                              (int)*(char *)(local_648._0_8_ +
                                                            (long)_space_ofs.
                                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar27] +
                                                  (long)local_618 * local_648._16_8_ * uVar26 +
                                                  (long)(iStack_624 * iVar14 * this->stride_h) +
                                                  (long)(int)uVar20 * (long)this->stride_w);
                            uVar27 = uVar27 + 1;
                          } while (uVar31 != uVar27);
                        }
                        lVar18 = lVar18 + __n;
                        uVar26 = uVar26 + 1;
                      } while (uVar26 != uVar1);
                    }
                    *(int *)((long)local_6e8 + uVar20 * 4) = iVar29;
                    uVar20 = uVar20 + 1;
                  } while (uVar20 != uVar32);
                }
                local_6e8 = (void *)((long)local_6e8 + (long)(int)uVar32 * 4);
                bVar35 = iVar14 != iVar28;
                iVar14 = iVar14 + 1;
              } while (bVar35);
              uVar20 = (ulong)(uint)this->num_output;
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 < (int)uVar20);
        }
        opt_g_1.workspace_allocator = opt->workspace_allocator;
        opt_g_1.lightmode = opt->lightmode;
        opt_g_1._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g_1.num_threads = opt->num_threads;
        opt_g_1.blob_allocator = top_blob->allocator;
        (*this->dequantize->_vptr_Layer[7])();
      }
      if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar14 = 0;
    }
  }
  else {
    copy_make_border((Mat *)&pd,(Mat *)local_648,iVar23,iVar23,iVar14,iVar14,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
LAB_00135ca9:
    iVar14 = -100;
    if (((void *)local_648._0_8_ != (void *)0x0) && ((long)uStack_620._4_4_ * (long)local_618 != 0))
    {
      iVar28 = (int)uStack_620;
      iVar29 = iStack_624;
      goto LAB_00135d42;
    }
  }
  if ((int *)local_648._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_648._8_8_ = *(int *)local_648._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_648._8_8_ == 0) {
      if ((Allocator *)local_648._24_8_ == (Allocator *)0x0) {
        if ((void *)local_648._0_8_ != (void *)0x0) {
          free(*(void **)(local_648._0_8_ - 8));
        }
      }
      else {
        (**(code **)(*(long *)local_648._24_8_ + 8))();
      }
    }
  }
LAB_0013631e:
  if (pd._8_8_ != 0) {
    LOCK();
    *(int *)pd._8_8_ = *(int *)pd._8_8_ + -1;
    UNLOCK();
    if (*(int *)pd._8_8_ == 0) {
      if (pd.params[0].v.data == (void *)0x0) {
        if (pd._0_8_ != 0) {
          free(*(void **)(pd._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*pd.params[0].v.data + 8))();
      }
    }
  }
  return iVar14;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            pd.use_int8_inference = use_int8_inference;

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = Mat(1, (size_t)4u, (void*)&weight_data_int8_scale);
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* outptr = top_blob.channel(p);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                    // channels
                    for (int q=0; q<channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            int val = sptr[ space_ofs[k] ];
                            int w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        // dequantize, reverse scale inplace
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = top_blob.allocator;

            dequantize->forward_inplace(top_blob, opt_g);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}